

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_check_sig_hash(mbedtls_ssl_context *ssl,mbedtls_md_type_t md)

{
  mbedtls_md_type_t mVar1;
  int iVar2;
  mbedtls_md_type_t *pmVar3;
  
  pmVar3 = (mbedtls_md_type_t *)ssl->conf->sig_hashes;
  iVar2 = -1;
  if (pmVar3 != (mbedtls_md_type_t *)0x0) {
    do {
      mVar1 = *pmVar3;
      if (mVar1 == MBEDTLS_MD_NONE) {
        return -1;
      }
      pmVar3 = pmVar3 + 1;
    } while (mVar1 != md);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_check_sig_hash( const mbedtls_ssl_context *ssl,
                                mbedtls_md_type_t md )
{
    const int *cur;

    if( ssl->conf->sig_hashes == NULL )
        return( -1 );

    for( cur = ssl->conf->sig_hashes; *cur != MBEDTLS_MD_NONE; cur++ )
        if( *cur == (int) md )
            return( 0 );

    return( -1 );
}